

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserNodeInfo * xmlParserFindNodeInfo(xmlParserCtxtPtr ctx,xmlNodePtr node)

{
  unsigned_long uVar1;
  unsigned_long pos;
  xmlNodePtr node_local;
  xmlParserCtxtPtr ctx_local;
  
  if ((ctx == (xmlParserCtxtPtr)0x0) || (node == (xmlNodePtr)0x0)) {
    ctx_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    uVar1 = xmlParserFindNodeInfoIndex(&ctx->node_seq,node);
    if ((uVar1 < (ctx->node_seq).length) && ((ctx->node_seq).buffer[uVar1].node == node)) {
      ctx_local = (xmlParserCtxtPtr)((ctx->node_seq).buffer + uVar1);
    }
    else {
      ctx_local = (xmlParserCtxtPtr)0x0;
    }
  }
  return (xmlParserNodeInfo *)ctx_local;
}

Assistant:

const xmlParserNodeInfo *
xmlParserFindNodeInfo(const xmlParserCtxtPtr ctx, const xmlNodePtr node)
{
    unsigned long pos;

    if ((ctx == NULL) || (node == NULL))
        return (NULL);
    /* Find position where node should be at */
    pos = xmlParserFindNodeInfoIndex(&ctx->node_seq, node);
    if (pos < ctx->node_seq.length
        && ctx->node_seq.buffer[pos].node == node)
        return &ctx->node_seq.buffer[pos];
    else
        return NULL;
}